

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.h
# Opt level: O0

void __thiscall spv::Builder::setDebugSourceLocation(Builder *this,int line,char *filename)

{
  Id IVar1;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *filename_local;
  Builder *pBStack_10;
  int line_local;
  Builder *this_local;
  
  if ((((this->trackDebugInfo & 1U) != 0) && (this->dirtyLineTracker = true, line != 0)) &&
     (this->currentLine = line, filename != (char *)0x0)) {
    local_20 = filename;
    filename_local._4_4_ = line;
    pBStack_10 = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,filename,&local_41);
    IVar1 = getStringId(this,&local_40);
    this->currentFileId = IVar1;
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return;
}

Assistant:

void setDebugSourceLocation(int line, const char* filename)
    {
        if (trackDebugInfo) {
            dirtyLineTracker = true;
            if (line != 0) {
                // TODO: This is special handling of some AST nodes having (untracked) line 0. 
                //       But they should have a valid line number.
                currentLine = line;
                if (filename) {
                    currentFileId = getStringId(filename);
                }
            }
        }
    }